

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pass.cc
# Opt level: O2

void __thiscall kratos::PassManager::run_passes(PassManager *this,Generator *generator)

{
  uint uVar1;
  key_type *pkVar2;
  _func_int **pp_Var3;
  _func_int *p_Var4;
  iterator __begin2;
  key_type *pkVar5;
  mapped_type *__x;
  ostream *poVar6;
  ulong uVar7;
  key_type *__k;
  undefined1 local_60 [8];
  mapped_type fn;
  
  __k = *(key_type **)(this + 0x30);
  pkVar2 = *(key_type **)(this + 0x38);
  uVar7 = 0;
  pkVar5 = __k;
  if (this[0x48] == (PassManager)0x1) {
    for (; pkVar5 != pkVar2; pkVar5 = pkVar5 + 1) {
      uVar1 = (uint)pkVar5->_M_string_length;
      if ((int)uVar7 <= (int)uVar1) {
        uVar7 = (ulong)uVar1;
      }
    }
  }
  fn._M_invoker = (_Invoker_type)generator;
  for (; __k != pkVar2; __k = __k + 1) {
    __x = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
          ::at((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::function<void_(kratos::Generator_*)>_>_>_>
                *)this,__k);
    std::function<void_(kratos::Generator_*)>::function
              ((function<void_(kratos::Generator_*)> *)local_60,__x);
    std::chrono::_V2::system_clock::now();
    std::function<void_(kratos::Generator_*)>::operator()
              ((function<void_(kratos::Generator_*)> *)local_60,(Generator *)fn._M_invoker);
    if (this[0x48] == (PassManager)0x1) {
      std::chrono::_V2::system_clock::now();
      poVar6 = std::operator<<((ostream *)&std::cout,"[name]: ");
      pp_Var3 = poVar6->_vptr_basic_ostream;
      p_Var4 = pp_Var3[-3];
      *(uint *)(&poVar6->field_0x18 + (long)p_Var4) =
           *(uint *)(&poVar6->field_0x18 + (long)p_Var4) & 0xffffff4f | 0x20;
      *(ulong *)(&poVar6->field_0x10 + (long)pp_Var3[-3]) = uVar7;
      poVar6 = std::operator<<(poVar6,(string *)__k);
      poVar6 = std::operator<<(poVar6,"\t[time]: ");
      poVar6 = std::ostream::_M_insert<long>((long)poVar6);
      poVar6 = std::operator<<(poVar6," ms");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    std::_Function_base::~_Function_base((_Function_base *)local_60);
  }
  return;
}

Assistant:

void PassManager::run_passes(Generator* generator) {
    // compute padding
    int string_size = 0;
    if (collect_perf_) {
        for (auto const& fn_name : passes_order_) {
            auto s = static_cast<int>(fn_name.size());
            if (s > string_size) {
                string_size = s;
            }
        }
    }

    for (const auto& fn_name : passes_order_) {
        auto fn = passes_.at(fn_name);
        auto start = std::chrono::system_clock::now();
        fn(generator);

        if (collect_perf_) {
            auto end = std::chrono::system_clock::now();
            auto diff = end - start;
            auto time = std::chrono::duration_cast<std::chrono::milliseconds>(diff).count();
            std::cout << "[name]: " << std::left << std::setw(string_size) << fn_name
                      << "\t[time]: " << time << " ms" << std::endl;
        }
    }
}